

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::type_caster_generic::src_and_type
          (void *src,type_info *cast_type,type_info *rtti_type)

{
  type_info *ptVar1;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  string msg;
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)cast_type;
  ptVar1 = get_type_info((type_index *)&local_40,false);
  if (ptVar1 == (type_info *)0x0) {
    if (rtti_type != (type_info *)0x0) {
      cast_type = rtti_type;
    }
    std::__cxx11::string::string
              ((string *)&local_40,*(char **)(cast_type + 8) + (**(char **)(cast_type + 8) == '*'),
               (allocator *)&local_60);
    clean_type_id(&local_40);
    std::operator+(&local_60,"Unregistered type : ",&local_40);
    PyErr_SetString(_PyExc_TypeError,local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    src = (void *)0x0;
  }
  pVar2.second = ptVar1;
  pVar2.first = src;
  return pVar2;
}

Assistant:

PYBIND11_NOINLINE static std::pair<const void *, const type_info *> src_and_type(
            const void *src, const std::type_info &cast_type, const std::type_info *rtti_type = nullptr) {
        if (auto *tpi = get_type_info(cast_type))
            return {src, const_cast<const type_info *>(tpi)};

        // Not found, set error:
        std::string tname = rtti_type ? rtti_type->name() : cast_type.name();
        detail::clean_type_id(tname);
        std::string msg = "Unregistered type : " + tname;
        PyErr_SetString(PyExc_TypeError, msg.c_str());
        return {nullptr, nullptr};
    }